

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O2

void add_zeros_and_len_padding(uchar *output,size_t output_len,size_t data_len)

{
  ulong uVar1;
  
  for (uVar1 = 1; uVar1 = uVar1 & 0xff, uVar1 < output_len - data_len;
      uVar1 = (ulong)((int)uVar1 + 1)) {
    output[uVar1 + (data_len - 1)] = '\0';
  }
  output[output_len - 1] = (uchar)(output_len - data_len);
  return;
}

Assistant:

static void add_zeros_and_len_padding( unsigned char *output,
                                       size_t output_len, size_t data_len )
{
    size_t padding_len = output_len - data_len;
    unsigned char i = 0;

    for( i = 1; i < padding_len; i++ )
        output[data_len + i - 1] = 0x00;
    output[output_len - 1] = (unsigned char) padding_len;
}